

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::UnsafeShallowSwap(MapFieldBase *this,MapFieldBase *other)

{
  LogMessage *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  MapFieldBase *local_18;
  MapFieldBase *other_local;
  MapFieldBase *this_local;
  
  local_51 = 0;
  local_18 = other;
  other_local = this;
  if (this->arena_ != other->arena_) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
               ,100);
    local_51 = 1;
    other_00 = LogMessage::operator<<(&local_50,"CHECK failed: (arena_) == (other->arena_): ");
    LogFinisher::operator=(local_65,other_00);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  InternalSwap(this,local_18);
  return;
}

Assistant:

void MapFieldBase::UnsafeShallowSwap(MapFieldBase* other) {
  GOOGLE_DCHECK_EQ(arena_, other->arena_);
  InternalSwap(other);
}